

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

MockSpec<BasicTestExpr<2>_(bool)> * __thiscall
testing::internal::FunctionMocker<BasicTestExpr<2>_(bool)>::With
          (FunctionMocker<BasicTestExpr<2>_(bool)> *this,Matcher<bool> *m1)

{
  MatcherBase<bool> local_20;
  
  Matcher<bool>::Matcher((Matcher<bool> *)&local_20,m1);
  linked_ptr<const_testing::MatcherInterface<bool>_>::operator=
            ((linked_ptr<const_testing::MatcherInterface<bool>_> *)
             ((long)&(this->super_FunctionMockerBase<BasicTestExpr<2>_(bool)>).current_spec_.
                     matchers_.super__Tuple_impl<0UL,_testing::Matcher<bool>_>.
                     super__Head_base<0UL,_testing::Matcher<bool>,_false>._M_head_impl.
                     super_MatcherBase<bool> + 8),&local_20.impl_);
  MatcherBase<bool>::~MatcherBase(&local_20);
  return &(this->super_FunctionMockerBase<BasicTestExpr<2>_(bool)>).current_spec_;
}

Assistant:

MockSpec<F>& With(const Matcher<A1>& m1) {
    this->current_spec().SetMatchers(::std::tr1::make_tuple(m1));
    return this->current_spec();
  }